

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptLibrary.cpp
# Opt level: O2

bool Js::JavascriptLibrary::InitializeTypedArrayConstructor
               (DynamicObject *typedArrayConstructor,DeferredTypeHandlerBase *typeHandler,
               DeferredInitializeMode mode)

{
  JavascriptLibrary *this;
  JavascriptString *pJVar1;
  
  DeferredTypeHandlerBase::Convert(typeHandler,typedArrayConstructor,mode,5,0);
  this = (((typedArrayConstructor->super_RecyclableObject).type.ptr)->javascriptLibrary).ptr;
  (*(typedArrayConstructor->super_RecyclableObject).super_FinalizableObject.
    super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[0x1e])
            (typedArrayConstructor,0xd1,&DAT_1000000000003,2,0,0,0);
  pJVar1 = CreateStringFromCppLiteral<11ul>(this,(char16 (*) [11])L"TypedArray");
  (*(typedArrayConstructor->super_RecyclableObject).super_FinalizableObject.
    super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[0x1e])
            (typedArrayConstructor,0x106,pJVar1,2,0,0,0);
  (*(typedArrayConstructor->super_RecyclableObject).super_FinalizableObject.
    super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[0x1e])
            (typedArrayConstructor,0x124,(this->super_JavascriptLibraryBase).typedArrayPrototype.ptr
             ,0,0,0,0);
  AddFunctionToLibraryObject
            (this,typedArrayConstructor,0x95,(FunctionInfo *)TypedArrayBase::EntryInfo::From,1,
             '\x06');
  AddFunctionToLibraryObject
            (this,typedArrayConstructor,0x11c,(FunctionInfo *)TypedArrayBase::EntryInfo::Of,0,'\x06'
            );
  AddSpeciesAccessorsToLibraryObject
            (this,typedArrayConstructor,
             (FunctionInfo *)TypedArrayBase::EntryInfo::GetterSymbolSpecies);
  DynamicObject::SetHasNoEnumerableProperties(typedArrayConstructor,true);
  return true;
}

Assistant:

bool JavascriptLibrary::InitializeTypedArrayConstructor(DynamicObject* typedArrayConstructor, DeferredTypeHandlerBase * typeHandler, DeferredInitializeMode mode)
    {
        typeHandler->Convert(typedArrayConstructor, mode, 5);

        JavascriptLibrary* library = typedArrayConstructor->GetLibrary();

        library->AddMember(typedArrayConstructor, PropertyIds::length, TaggedInt::ToVarUnchecked(3), PropertyConfigurable);
        library->AddMember(typedArrayConstructor, PropertyIds::name, library->CreateStringFromCppLiteral(_u("TypedArray")), PropertyConfigurable);
        library->AddMember(typedArrayConstructor, PropertyIds::prototype, library->typedArrayPrototype, PropertyNone);

        library->AddFunctionToLibraryObject(typedArrayConstructor, PropertyIds::from, &TypedArrayBase::EntryInfo::From, 1);
        library->AddFunctionToLibraryObject(typedArrayConstructor, PropertyIds::of, &TypedArrayBase::EntryInfo::Of, 0);
        library->AddSpeciesAccessorsToLibraryObject(typedArrayConstructor, &TypedArrayBase::EntryInfo::GetterSymbolSpecies);

        typedArrayConstructor->SetHasNoEnumerableProperties(true);

        return true;
    }